

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_swrenderer.cpp
# Opt level: O0

void __thiscall
FSoftwareRenderer::RenderTextureView
          (FSoftwareRenderer *this,FCanvasTexture *tex,AActor *viewpoint,int fov)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int srcpitch;
  undefined4 extraout_var;
  DSimpleCanvas *canvas;
  BYTE *pBVar4;
  TAngle<double> local_60;
  TAngle<double> local_58;
  TAngle<double> local_50;
  DAngle savedfov;
  FSpecialColormap *savecm;
  uchar *savecolormap;
  DSimpleCanvas *Canvas;
  BYTE *Pixels;
  int fov_local;
  AActor *viewpoint_local;
  FCanvasTexture *tex_local;
  FSoftwareRenderer *this_local;
  BYTE *dst;
  
  iVar2 = (*(tex->super_FTexture)._vptr_FTexture[3])();
  dst = (BYTE *)CONCAT44(extraout_var,iVar2);
  canvas = FCanvasTexture::GetCanvas(tex);
  uVar1 = swrenderer::fixedcolormap;
  savedfov.Degrees = swrenderer::realfixedcolormap;
  TAngle<double>::TAngle(&local_50,&FieldOfView);
  TAngle<double>::TAngle(&local_58,(double)fov);
  R_SetFOV(&local_58);
  iVar2 = FTexture::GetWidth(&tex->super_FTexture);
  iVar3 = FTexture::GetHeight(&tex->super_FTexture);
  swrenderer::R_RenderViewToCanvas
            (viewpoint,&canvas->super_DCanvas,0,0,iVar2,iVar3,(bool)(tex->bFirstUpdate & 1));
  TAngle<double>::TAngle(&local_60,&local_50);
  R_SetFOV(&local_60);
  pBVar4 = DCanvas::GetBuffer(&canvas->super_DCanvas);
  if (dst == pBVar4) {
    iVar2 = FTexture::GetWidth(&tex->super_FTexture);
    iVar3 = FTexture::GetHeight(&tex->super_FTexture);
    FTexture::FlipSquareBlockRemap(dst,iVar2,iVar3,GPalette.Remap);
  }
  else {
    pBVar4 = DCanvas::GetBuffer(&canvas->super_DCanvas);
    iVar2 = FTexture::GetWidth(&tex->super_FTexture);
    iVar3 = FTexture::GetHeight(&tex->super_FTexture);
    srcpitch = DCanvas::GetPitch(&canvas->super_DCanvas);
    FTexture::FlipNonSquareBlockRemap(dst,pBVar4,iVar2,iVar3,srcpitch,GPalette.Remap);
  }
  FCanvasTexture::SetUpdated(tex);
  swrenderer::fixedcolormap = uVar1;
  swrenderer::realfixedcolormap = savedfov.Degrees;
  return;
}

Assistant:

void FSoftwareRenderer::RenderTextureView (FCanvasTexture *tex, AActor *viewpoint, int fov)
{
	BYTE *Pixels = const_cast<BYTE*>(tex->GetPixels());
	DSimpleCanvas *Canvas = tex->GetCanvas();

	// curse Doom's overuse of global variables in the renderer.
	// These get clobbered by rendering to a camera texture but they need to be preserved so the final rendering can be done with the correct palette.
	unsigned char *savecolormap = fixedcolormap;
	FSpecialColormap *savecm = realfixedcolormap;

	DAngle savedfov = FieldOfView;
	R_SetFOV ((double)fov);
	R_RenderViewToCanvas (viewpoint, Canvas, 0, 0, tex->GetWidth(), tex->GetHeight(), tex->bFirstUpdate);
	R_SetFOV (savedfov);
	if (Pixels == Canvas->GetBuffer())
	{
		FTexture::FlipSquareBlockRemap (Pixels, tex->GetWidth(), tex->GetHeight(), GPalette.Remap);
	}
	else
	{
		FTexture::FlipNonSquareBlockRemap (Pixels, Canvas->GetBuffer(), tex->GetWidth(), tex->GetHeight(), Canvas->GetPitch(), GPalette.Remap);
	}
	tex->SetUpdated();
	fixedcolormap = savecolormap;
	realfixedcolormap = savecm;
}